

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O0

int __thiscall
dynamicgraph::Signal<double,_int>::access(Signal<double,_int> *this,char *__name,int __type)

{
  SignalType SVar1;
  int iVar2;
  double *pdVar3;
  bool *pbVar4;
  MutexError *anon_var_0_1;
  MutexError *anon_var_0;
  int *t_local;
  Signal<double,_int> *this_local;
  
  SVar1 = this->signalType;
  if (SVar1 != CONSTANT) {
    if (SVar1 - REFERENCE < 2) {
      if (this->providerMutex == (Mutex *)0x0) {
        this->copyInit = true;
        (this->super_SignalBase<int>).signalTime = *(int *)__name;
        pdVar3 = setTcopy(this,this->Treference);
        this_local._0_4_ = (int)pdVar3;
        return (int)this_local;
      }
      this->copyInit = true;
      (this->super_SignalBase<int>).signalTime = *(int *)__name;
      pdVar3 = setTcopy(this,this->Treference);
      this_local._0_4_ = (int)pdVar3;
      return (int)this_local;
    }
    if (SVar1 == FUNCTION) {
      if (this->providerMutex == (Mutex *)0x0) {
        (this->super_SignalBase<int>).signalTime = *(int *)__name;
        pdVar3 = getTwork(this);
        boost::function2<double_&,_double_&,_int>::operator()
                  (&this->Tfunction,pdVar3,*(int *)__name);
        this->copyInit = true;
        pdVar3 = switchTcopy(this);
        return (int)pdVar3;
      }
      (this->super_SignalBase<int>).signalTime = *(int *)__name;
      pdVar3 = getTwork(this);
      boost::function2<double_&,_double_&,_int>::operator()(&this->Tfunction,pdVar3,*(int *)__name);
      this->copyInit = true;
      pdVar3 = switchTcopy(this);
      this_local._0_4_ = (int)pdVar3;
      return (int)this_local;
    }
  }
  pbVar4 = SignalBase<int>::getReady(&this->super_SignalBase<int>);
  if ((*pbVar4 & 1U) != 0) {
    SignalBase<int>::setReady(&this->super_SignalBase<int>,false);
    (*(this->super_SignalBase<int>)._vptr_SignalBase[3])(this,__name);
  }
  iVar2 = (*(this->super_SignalBase<int>)._vptr_SignalBase[0x1d])();
  return iVar2;
}

Assistant:

const T &Signal<T, Time>::access(const Time &t) {
  switch (signalType) {
    case REFERENCE:
    case REFERENCE_NON_CONST: {
      if (NULL == providerMutex) {
        copyInit = true;
        signalTime = t;
        return setTcopy(*Treference);
      } else {
        try {
#ifdef HAVE_LIBBOOST_THREAD
          boost::try_mutex::scoped_try_lock lock(*providerMutex);
#endif
          copyInit = true;
          signalTime = t;
          return setTcopy(*Treference);
        } catch (const MutexError &) {
          return accessCopy();
        }
      }

      break;
    }

    case FUNCTION: {
      if (NULL == providerMutex) {
        signalTime = t;
        Tfunction(getTwork(), t);
        copyInit = true;
        return switchTcopy();
      } else {
        try {
#ifdef HAVE_LIBBOOST_THREAD
          boost::try_mutex::scoped_try_lock lock(*providerMutex);
#endif
          signalTime = t;
          Tfunction(getTwork(), t);
          copyInit = true;
          return switchTcopy();
        } catch (const MutexError &) {
          return accessCopy();
        }
      }
      break;
    }
    case CONSTANT:
    default:
      if (this->getReady()) {
        setReady(false);
        this->setTime(t);
      }
      return accessCopy();
  };
}